

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_ManPrintDistrib(Cba_Man_t *p)

{
  int *pUserCounts;
  Cba_Ntk_t *p_00;
  int i;
  int pCounts [90];
  
  memset(pCounts,0,0x168);
  pUserCounts = (int *)calloc((long)(p->vNtks).nSize,4);
  Cba_ManCreatePrimMap(p->pTypeNames);
  for (i = 1; i < (p->vNtks).nSize; i = i + 1) {
    p_00 = Cba_ManNtk(p,i);
    Cba_NtkCollectDistrib(p_00,pCounts,pUserCounts);
  }
  Cba_ManPrintDistribStat(p,pCounts,pUserCounts);
  free(pUserCounts);
  return;
}

Assistant:

void Cba_ManPrintDistrib( Cba_Man_t * p )
{
    Cba_Ntk_t * pNtk; int i;
    int pCounts[CBA_BOX_LAST] = {0};
    int * pUserCounts = ABC_CALLOC( int, Cba_ManNtkNum(p) + 1 );
    Cba_ManCreatePrimMap( p->pTypeNames );
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_NtkCollectDistrib( pNtk, pCounts, pUserCounts );
    Cba_ManPrintDistribStat( p, pCounts, pUserCounts );
    ABC_FREE( pUserCounts );
}